

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lightsamplers.cpp
# Opt level: O3

string * __thiscall
pbrt::ExhaustiveLightSampler::ToString_abi_cxx11_
          (string *__return_storage_ptr__,ExhaustiveLightSampler *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  detail::
  stringPrintfRecursive<pstd::vector<pbrt::LightBounds,pstd::pmr::polymorphic_allocator<pbrt::LightBounds>>const&>
            (__return_storage_ptr__,"[ ExhaustiveLightSampler lightBounds: %s]",&this->lightBounds);
  return __return_storage_ptr__;
}

Assistant:

std::string ExhaustiveLightSampler::ToString() const {
    return StringPrintf("[ ExhaustiveLightSampler lightBounds: %s]", lightBounds);
}